

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::AddCapability(IRContext *this,Capability capability)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  bool bVar1;
  FeatureManager *this_00;
  Instruction *this_01;
  Operand *local_c8;
  allocator<spvtools::opt::Operand> local_b5;
  Capability local_b4;
  Capability *local_b0;
  undefined8 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  iterator local_48;
  _func_int **local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  capability_inst;
  Capability capability_local;
  IRContext *this_local;
  
  capability_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = capability;
  this_00 = get_feature_mgr(this);
  bVar1 = FeatureManager::HasCapability
                    (this_00,capability_inst._M_t.
                             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                             _M_head_impl._4_4_);
  if (!bVar1) {
    this_01 = (Instruction *)operator_new(0x70);
    local_b4 = capability_inst._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    local_b0 = &local_b4;
    local_a8 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_b0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
    Operand::Operand(&local_78,SPV_OPERAND_TYPE_CAPABILITY,&local_a0);
    local_48 = &local_78;
    local_40 = (_func_int **)0x1;
    std::allocator<spvtools::opt::Operand>::allocator(&local_b5);
    __l._M_len = (size_type)local_40;
    __l._M_array = local_48;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_38,__l,&local_b5);
    Instruction::Instruction(this_01,this,OpCapability,0,0,&local_38);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_20,this_01);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_b5);
    local_c8 = (Operand *)&local_48;
    do {
      local_c8 = local_c8 + -1;
      Operand::~Operand(local_c8);
    } while (local_c8 != &local_78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    AddCapability(this,&local_20);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_20);
  }
  return;
}

Assistant:

void IRContext::AddCapability(spv::Capability capability) {
  if (!get_feature_mgr()->HasCapability(capability)) {
    std::unique_ptr<Instruction> capability_inst(new Instruction(
        this, spv::Op::OpCapability, 0, 0,
        {{SPV_OPERAND_TYPE_CAPABILITY, {static_cast<uint32_t>(capability)}}}));
    AddCapability(std::move(capability_inst));
  }
}